

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_48;
  size_t streamingSize;
  size_t outBuffSize;
  size_t inBuffSize;
  size_t blockSize;
  size_t CCtxSize;
  ZSTD_CCtx_params *params_local;
  
  if (params->nbWorkers < 1) {
    sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams(params);
    if ((ulong)(1L << ((byte)(params->cParams).windowLog & 0x3f)) < 0x20001) {
      local_48 = 1L << ((byte)(params->cParams).windowLog & 0x3f);
    }
    else {
      local_48 = 0x20000;
    }
    uVar1 = (params->cParams).windowLog;
    sVar3 = ZSTD_compressBound(local_48);
    params_local = (ZSTD_CCtx_params *)(sVar2 + (1L << ((byte)uVar1 & 0x3f)) + local_48 + sVar3 + 1)
    ;
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   size_t const CCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(params);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << params->cParams.windowLog);
        size_t const inBuffSize = ((size_t)1 << params->cParams.windowLog) + blockSize;
        size_t const outBuffSize = ZSTD_compressBound(blockSize) + 1;
        size_t const streamingSize = inBuffSize + outBuffSize;

        return CCtxSize + streamingSize;
    }
}